

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraUtilPerm.c
# Opt level: O3

Abc_ZddMan * Abc_ZddManAlloc(int nVars,int nObjs)

{
  uint uVar1;
  Abc_ZddMan *p;
  int *piVar2;
  Abc_ZddEnt *pAVar3;
  Abc_ZddObj *pAVar4;
  int iVar5;
  uint uVar6;
  ulong __nmemb;
  
  p = (Abc_ZddMan *)calloc(1,0x60);
  p->nVars = nVars;
  p->nObjsAlloc = nObjs;
  iVar5 = 0x1f;
  if (nObjs - 1U != 0) {
    for (; nObjs - 1U >> iVar5 == 0; iVar5 = iVar5 + -1) {
    }
  }
  uVar1 = (uint)(byte)(0x20 - ((byte)iVar5 ^ 0x1f));
  if ((uint)nObjs < 2) {
    uVar1 = nObjs;
  }
  uVar6 = -1 << ((byte)uVar1 & 0x1f);
  uVar1 = ~uVar6;
  p->nUniqueMask = uVar1;
  p->nCacheMask = uVar1;
  __nmemb = (ulong)-uVar6;
  piVar2 = (int *)calloc(__nmemb,4);
  p->pUnique = piVar2;
  piVar2 = (int *)calloc((long)nObjs,4);
  p->pNexts = piVar2;
  pAVar3 = (Abc_ZddEnt *)calloc(__nmemb,0x10);
  p->pCache = pAVar3;
  pAVar4 = (Abc_ZddObj *)calloc((long)nObjs,0xc);
  p->pObjs = pAVar4;
  p->nObjs = 2;
  pAVar4->True = 0xffffffff;
  pAVar4->False = 0xffffffff;
  *(undefined4 *)(pAVar4 + 1) = 0xffffffff;
  pAVar4[1].True = 0xffffffff;
  pAVar4[1].False = 0xffffffff;
  *(uint *)pAVar4 = nVars | 0x80000000U;
  *(uint *)(pAVar4 + 1) = nVars | 0x80000000U;
  if (nVars < 1) {
    iVar5 = 2;
  }
  else {
    iVar5 = 0;
    do {
      Abc_ZddUniqueCreate(p,iVar5,1,0);
      iVar5 = iVar5 + 1;
    } while (nVars != iVar5);
    iVar5 = p->nObjs;
  }
  if (iVar5 == nVars + 2) {
    p->nMemory = ((ulong)((long)p->nObjsAlloc * 0xc) >> 2) +
                 (ulong)p->nUniqueMask + (long)p->nObjsAlloc + (ulong)(p->nCacheMask + 1) * 4 + 0x19
    ;
    return p;
  }
  __assert_fail("p->nObjs == nVars + 2",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/extra/extraUtilPerm.c"
                ,0xca,"Abc_ZddMan *Abc_ZddManAlloc(int, int)");
}

Assistant:

Abc_ZddMan * Abc_ZddManAlloc( int nVars, int nObjs )
{
    Abc_ZddMan * p; int i;
    p = ABC_CALLOC( Abc_ZddMan, 1 );
    p->nVars       = nVars;
    p->nObjsAlloc  = nObjs;
    p->nUniqueMask = (1 << Abc_Base2Log(nObjs)) - 1;
    p->nCacheMask  = (1 << Abc_Base2Log(nObjs)) - 1;
    p->pUnique     = ABC_CALLOC( int, p->nUniqueMask + 1 );
    p->pNexts      = ABC_CALLOC( int, p->nObjsAlloc );
    p->pCache      = ABC_CALLOC( Abc_ZddEnt, p->nCacheMask + 1 );
    p->pObjs       = ABC_CALLOC( Abc_ZddObj, p->nObjsAlloc );
    p->nObjs       = 2;
    memset( p->pObjs, 0xff, sizeof(Abc_ZddObj) * 2 );
    p->pObjs[0].Var = nVars;
    p->pObjs[1].Var = nVars;
    for ( i = 0; i < nVars; i++ )
        Abc_ZddUniqueCreate( p, i, 1, 0 );
    assert( p->nObjs == nVars + 2 );
    p->nMemory = sizeof(Abc_ZddMan)/4 + 
        p->nUniqueMask + 1 + p->nObjsAlloc + 
        (p->nCacheMask + 1) * sizeof(Abc_ZddEnt)/4 + 
        p->nObjsAlloc * sizeof(Abc_ZddObj)/4;
    return p;
}